

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetPropertyCommand.cxx
# Opt level: O2

bool __thiscall cmSetPropertyCommand::HandleTarget(cmSetPropertyCommand *this,cmTarget *target)

{
  char *pcVar1;
  pointer value;
  allocator local_41;
  string local_40;
  
  if (this->Remove == false) {
    value = (this->PropertyValue)._M_dataplus._M_p;
  }
  else {
    value = (char *)0x0;
  }
  pcVar1 = (this->PropertyName)._M_dataplus._M_p;
  if (this->AppendMode == true) {
    std::__cxx11::string::string((string *)&local_40,pcVar1,&local_41);
    cmTarget::AppendProperty(target,&local_40,value,this->AppendAsString);
  }
  else {
    std::__cxx11::string::string((string *)&local_40,pcVar1,&local_41);
    cmTarget::SetProperty(target,&local_40,value);
  }
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string((string *)&local_40,pcVar1,&local_41);
  cmTarget::CheckProperty(target,&local_40,(this->super_cmCommand).Makefile);
  std::__cxx11::string::~string((string *)&local_40);
  return true;
}

Assistant:

bool cmSetPropertyCommand::HandleTarget(cmTarget* target)
{
  // Set or append the property.
  const char* name = this->PropertyName.c_str();
  const char *value = this->PropertyValue.c_str();
  if (this->Remove)
    {
    value = 0;
    }
  if(this->AppendMode)
    {
    target->AppendProperty(name, value, this->AppendAsString);
    }
  else
    {
    target->SetProperty(name, value);
    }

  // Check the resulting value.
  target->CheckProperty(name, this->Makefile);

  return true;
}